

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceBlock
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string_view text;
  string_view text_00;
  
  text._M_str = "{";
  text._M_len = 1;
  bVar1 = ConsumeEndOfDeclaration(this,text,service_location);
  if (bVar1) {
    while (text_00._M_str = "}", text_00._M_len = 1,
          bVar1 = TryConsumeEndOfDeclaration(this,text_00,(LocationRecorder *)0x0), !bVar1) {
      if ((this->input_->current_).type == TYPE_END) {
        RecordError(this,(ErrorMaker)ZEXT816(0x105c529));
        return false;
      }
      bVar1 = ParseServiceStatement(this,service,service_location,containing_file);
      if (!bVar1) {
        SkipStatement(this);
      }
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseServiceBlock(ServiceDescriptorProto* service,
                               const LocationRecorder& service_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &service_location));

  while (!TryConsumeEndOfDeclaration("}", nullptr)) {
    if (AtEnd()) {
      RecordError("Reached end of input in service definition (missing '}').");
      return false;
    }

    if (!ParseServiceStatement(service, service_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  return true;
}